

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  ImFont **ptr;
  long lVar1;
  
  if (0 < (this->Fonts).Size) {
    lVar1 = 0;
    do {
      ImFont::~ImFont((this->Fonts).Data[lVar1]);
      if ((this->Fonts).Size <= lVar1) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                      ,0x38b,"value_type &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
      }
      ImGui::MemFree((this->Fonts).Data[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->Fonts).Size);
  }
  ptr = (this->Fonts).Data;
  if (ptr != (ImFont **)0x0) {
    (this->Fonts).Size = 0;
    (this->Fonts).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->Fonts).Data = (ImFont **)0x0;
  }
  return;
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    for (int i = 0; i < Fonts.Size; i++)
    {
        Fonts[i]->~ImFont();
        ImGui::MemFree(Fonts[i]);
    }
    Fonts.clear();
}